

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPulley.cpp
# Opt level: O2

void __thiscall chrono::ChLinkPulley::UpdateTime(ChLinkPulley *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar23 [64];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 extraout_var [56];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 local_378 [16];
  ChVector<double> Dxu;
  ChVector<double> D21_w;
  double local_320;
  ChVector<double> v_1;
  undefined8 uStack_300;
  undefined1 auStack_2f8 [32];
  ChVector<double> result_1;
  double local_288;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ChVector<double> Dzu;
  ChVector<double> v;
  ChVector<double> local_218;
  ChVector<double> local_1f8;
  double local_1d8;
  double local_1d0;
  ChVector<double> result;
  ChVector<double> v_2;
  double local_158;
  double dStack_150;
  ChFrame<double> abs_shaft2;
  ChFrame<double> abs_shaft1;
  undefined1 auVar18 [16];
  undefined1 auVar22 [64];
  
  ChLinkLockLock::UpdateTime(&this->super_ChLinkLockLock,mytime);
  abs_shaft2._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  v_1.m_data[2] = 0.0;
  abs_shaft2.coord.pos.m_data[2] = 0.0;
  v_1.m_data._0_16_ = ZEXT816(0);
  abs_shaft2.coord.pos.m_data[0] = 0.0;
  abs_shaft2.coord.pos.m_data[1] = 0.0;
  ChFrame<double>::ChFrame(&abs_shaft1,&v_1,(ChQuaternion<double> *)&abs_shaft2);
  auVar21 = _v_1;
  v_1.m_data[0] = 1.0;
  auVar22 = _v_1;
  auStack_2f8 = auVar21._32_32_;
  v_1.m_data = auVar22._0_24_;
  uStack_300 = 0.0;
  result_1.m_data[2] = 0.0;
  v_1.m_data = (double  [3])ZEXT824(0x3ff0000000000000);
  result_1.m_data._0_16_ = ZEXT816(0);
  ChFrame<double>::ChFrame(&abs_shaft2,&result_1,(ChQuaternion<double> *)&v_1);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)
             (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body1,
             &this->local_shaft1,&abs_shaft1);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)
             (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2,
             &this->local_shaft2,&abs_shaft2);
  Get_shaft_pos2(&v_1,this);
  Get_shaft_pos1(&result_1,this);
  result.m_data._0_16_ =
       vsubpd_avx((undefined1  [16])v_1.m_data._0_16_,(undefined1  [16])result_1.m_data._0_16_);
  dVar24 = v_1.m_data[2];
  v_1.m_data[0] = (double)&abs_shaft1.Amatrix;
  result.m_data[2] = dVar24 - result_1.m_data[2];
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&v_1,&result);
  local_1f8.m_data[2] = 0.0;
  Vnorm<double>(&v_1,&local_1f8);
  local_1f8.m_data[0] = v_1.m_data[0];
  local_1f8.m_data[1] = v_1.m_data[1];
  local_1f8.m_data[2] = v_1.m_data[2];
  v_1.m_data[0] = (double)&abs_shaft2.Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&v_1,&result);
  local_218.m_data[2] = 0.0;
  Vnorm<double>(&v_1,&local_218);
  local_218.m_data[0] = v_1.m_data[0];
  local_218.m_data[1] = v_1.m_data[1];
  local_218.m_data[2] = v_1.m_data[2];
  local_378._0_8_ = ChAtan2(local_1f8.m_data[0],local_1f8.m_data[1]);
  local_378._8_8_ = extraout_XMM0_Qb;
  auVar21._0_8_ = ChAtan2(local_218.m_data[0],local_218.m_data[1]);
  auVar21._8_56_ = extraout_var;
  auVar17._0_8_ = this->a1;
  auVar17._8_8_ = this->a2;
  auVar16._8_8_ = 0x401921fb54442d18;
  auVar16._0_8_ = 0x401921fb54442d18;
  auVar50._8_8_ = 0x7fffffffffffffff;
  auVar50._0_8_ = 0x7fffffffffffffff;
  auVar7 = vdivpd_avx(auVar17,auVar16);
  auVar18 = vunpcklpd_avx(local_378,auVar21._0_16_);
  auVar7 = vroundpd_avx(auVar7,9);
  auVar19 = vfmadd231pd_fma(auVar18,auVar16,auVar7);
  auVar29._0_8_ = auVar19._0_8_ + 6.283185307179586;
  auVar29._8_8_ = auVar19._8_8_ + 6.283185307179586;
  auVar7._8_8_ = 0xc01921fb54442d18;
  auVar7._0_8_ = 0xc01921fb54442d18;
  auVar16 = vaddpd_avx512vl(auVar19,auVar7);
  auVar7 = vsubpd_avx(auVar29,auVar17);
  auVar18 = vsubpd_avx(auVar19,auVar17);
  auVar17 = vandpd_avx(auVar7,auVar50);
  auVar7 = vandpd_avx(auVar18,auVar50);
  uVar8 = vcmppd_avx512vl(auVar17,auVar7,1);
  auVar17 = vblendmpd_avx512vl(auVar19,auVar29);
  bVar6 = (bool)((byte)(uVar8 & 3) & 1);
  auVar18._0_8_ = (ulong)bVar6 * auVar17._0_8_ | (ulong)!bVar6 * (long)auVar29._0_8_;
  uVar8 = (uVar8 & 3) >> 1;
  auVar18._8_8_ = uVar8 * auVar17._8_8_ | (ulong)!SUB81(uVar8,0) * (long)auVar29._8_8_;
  auVar17 = vsubpd_avx(auVar16,auVar18);
  auVar7 = vsubpd_avx(auVar19,auVar18);
  auVar17 = vandpd_avx(auVar17,auVar50);
  auVar7 = vandpd_avx(auVar7,auVar50);
  uVar8 = vcmppd_avx512vl(auVar17,auVar7,1);
  local_320 = 0.0;
  bVar6 = (bool)((byte)(uVar8 & 3) & 1);
  auVar19._0_8_ = (double)((ulong)bVar6 * auVar16._0_8_ | !bVar6 * auVar18._0_8_);
  uVar8 = (uVar8 & 3) >> 1;
  auVar19._8_8_ = uVar8 * auVar16._8_8_ | !SUB81(uVar8,0) * auVar18._8_8_;
  this->a1 = auVar19._0_8_;
  this->a2 = (double)auVar19._8_8_;
  if (this->checkphase != false) {
    auVar17 = vshufpd_avx(auVar19,auVar19,1);
    dVar24 = (auVar19._0_8_ - this->phase) - auVar17._0_8_ / this->tau;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar24;
    uVar9 = vcmpsd_avx512f(auVar30,ZEXT816(0x400921fb54442d18),0xe);
    bVar6 = (bool)((byte)uVar9 & 1);
    auVar20._0_8_ =
         (ulong)bVar6 * (long)(dVar24 + -6.283185307179586) + (ulong)!bVar6 * (long)dVar24;
    auVar20._8_8_ = 0;
    auVar17 = vminsd_avx(ZEXT816(0x3fe921fb54442d18),auVar20);
    auVar17 = vmaxsd_avx(ZEXT816(0xbfe921fb54442d18),auVar17);
    local_320 = auVar17._0_8_;
  }
  Get_shaft_dir1(&v_1,this);
  Get_shaft_dir1(&result_1,this);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = result.m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = result_1.m_data[0];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = result_1.m_data[1] * result.m_data[1];
  auVar17 = vfmadd231sd_fma(auVar31,(undefined1  [16])result.m_data._0_16_,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = result_1.m_data[2];
  auVar17 = vfmadd231sd_fma(auVar17,auVar39,auVar2);
  dVar24 = auVar17._0_8_;
  auVar44._0_8_ = dVar24 * v_1.m_data[0];
  auVar44._8_8_ = dVar24 * v_1.m_data[1];
  v.m_data._0_16_ = vsubpd_avx((undefined1  [16])result.m_data._0_16_,auVar44);
  v.m_data[2] = result.m_data[2] - dVar24 * v_1.m_data[2];
  Vnorm<double>(&D21_w,&v);
  dVar24 = ChVector<double>::Length(&v);
  this->shaft_dist = dVar24;
  Get_shaft_dir1(&v_1,this);
  auVar13._8_8_ = D21_w.m_data[2];
  auVar13._0_8_ = D21_w.m_data[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = D21_w.m_data[0];
  local_268 = v_1.m_data._0_16_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = v_1.m_data[2];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = v_1.m_data[0] * D21_w.m_data[2];
  auVar7 = vfmsub231sd_fma(auVar42,auVar32,auVar3);
  auVar17 = vunpcklpd_avx(auVar32,auVar13);
  local_278._8_8_ = auVar17._8_8_ * v_1.m_data[2];
  local_278._0_8_ = auVar17._0_8_ * v_1.m_data[1];
  dVar24 = acos((this->r1 - this->r2) / this->shaft_dist);
  dVar25 = cos(dVar24);
  local_1d0 = dVar25 * D21_w.m_data[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = D21_w.m_data[2];
  auVar17 = vmovhps_avx(auVar33,D21_w.m_data[0]);
  dVar26 = sin(dVar24);
  dVar27 = cos(dVar24);
  local_1d8 = dVar27 * D21_w.m_data[2];
  dVar28 = sin(dVar24);
  Get_shaft_pos1(&v_1,this);
  auVar18 = vfmsub132pd_fma(auVar13,local_278,local_268);
  local_288 = auVar7._0_8_;
  local_158 = auVar17._0_8_;
  dStack_150 = auVar17._8_8_;
  auVar45._0_8_ = dVar25 * local_158 + auVar18._0_8_ * dVar26;
  auVar45._8_8_ = dVar25 * dStack_150 + auVar18._8_8_ * dVar26;
  dVar25 = dVar26 * local_288 + local_1d0;
  dVar24 = this->r1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar25;
  auVar17 = vshufpd_avx(auVar45,auVar43,1);
  (this->belt_up1).m_data[0] = auVar17._0_8_ * dVar24 + v_1.m_data[0];
  (this->belt_up1).m_data[1] = auVar17._8_8_ * dVar24 + v_1.m_data[1];
  (this->belt_up1).m_data[2] = auVar45._0_8_ * dVar24 + v_1.m_data[2];
  Get_shaft_pos1(&v_1,this);
  auVar7 = vshufpd_avx(auVar18,auVar7,1);
  auVar34._0_8_ = auVar7._0_8_ * dVar28;
  auVar34._8_8_ = auVar7._8_8_ * dVar28;
  auVar15._8_8_ = dVar27 * D21_w.m_data[1];
  auVar15._0_8_ = dVar27 * D21_w.m_data[0];
  auVar7 = vsubpd_avx(auVar15,auVar34);
  dVar26 = local_1d8 - auVar18._0_8_ * dVar28;
  dVar24 = this->r1;
  (this->belt_low1).m_data[0] = auVar7._0_8_ * dVar24 + v_1.m_data[0];
  (this->belt_low1).m_data[1] = auVar7._8_8_ * dVar24 + v_1.m_data[1];
  (this->belt_low1).m_data[2] = dVar26 * dVar24 + v_1.m_data[2];
  Get_shaft_pos1(&v_1,this);
  dVar24 = this->r2;
  (this->belt_up2).m_data[0] = dVar24 * auVar17._0_8_ + v_1.m_data[0] + v.m_data[0];
  (this->belt_up2).m_data[1] = dVar24 * auVar17._8_8_ + v_1.m_data[1] + v.m_data[1];
  (this->belt_up2).m_data[2] = v_1.m_data[2] + v.m_data[2] + dVar24 * auVar45._0_8_;
  Get_shaft_pos1(&v_1,this);
  dVar24 = this->r2;
  (this->belt_low2).m_data[0] = dVar24 * auVar7._0_8_ + v_1.m_data[0] + v.m_data[0];
  (this->belt_low2).m_data[1] = dVar24 * auVar7._8_8_ + v_1.m_data[1] + v.m_data[1];
  (this->belt_low2).m_data[2] = v_1.m_data[2] + v.m_data[2] + dVar24 * dVar26;
  auVar17 = vsubpd_avx(*(undefined1 (*) [16])(this->belt_up2).m_data,
                       *(undefined1 (*) [16])(this->belt_up1).m_data);
  v_1.m_data[2] = (this->belt_up2).m_data[2] - (this->belt_up1).m_data[2];
  v_1.m_data[0] = (double)auVar17._0_8_;
  v_1.m_data[1] = (double)auVar17._8_8_;
  Vnorm<double>(&Dxu,&v_1);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = Dxu.m_data[0];
  auVar46._8_8_ = Dxu.m_data[2];
  auVar46._0_8_ = Dxu.m_data[2];
  auVar11._8_8_ = Dxu.m_data[2];
  auVar11._0_8_ = Dxu.m_data[1];
  auVar17 = vshufpd_avx(auVar45,auVar45,1);
  auVar7 = vunpcklpd_avx(auVar46,auVar40);
  auVar47._0_8_ = dVar25 * auVar7._0_8_;
  auVar47._8_8_ = auVar17._8_8_ * auVar7._8_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar17._0_8_ * Dxu.m_data[1];
  auVar7 = vfmsub231sd_fma(auVar35,auVar40,auVar43);
  auVar17 = vfmsub231pd_fma(auVar47,auVar11,auVar45);
  v_1.m_data[2] = auVar7._0_8_;
  v_1.m_data[0] = (double)auVar17._0_8_;
  v_1.m_data[1] = (double)auVar17._8_8_;
  Vnorm<double>(&Dzu,&v_1);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = Dzu.m_data[0];
  auVar48._8_8_ = Dzu.m_data[2];
  auVar48._0_8_ = Dzu.m_data[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = Dxu.m_data[0];
  auVar51._8_8_ = Dxu.m_data[2];
  auVar51._0_8_ = Dxu.m_data[2];
  auVar14._8_8_ = Dzu.m_data[2];
  auVar14._0_8_ = Dzu.m_data[1];
  auVar12._8_8_ = Dxu.m_data[2];
  auVar12._0_8_ = Dxu.m_data[1];
  auVar17 = vunpcklpd_avx(auVar48,auVar41);
  auVar7 = vunpcklpd_avx(auVar51,auVar36);
  auVar49._0_8_ = Dxu.m_data[1] * auVar17._0_8_;
  auVar49._8_8_ = Dxu.m_data[2] * auVar17._8_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = Dxu.m_data[0] * Dzu.m_data[1];
  auVar17 = vfmsub231sd_fma(auVar37,auVar41,auVar12);
  result_1.m_data._0_16_ = vfmsub213pd_fma(auVar7,auVar14,auVar49);
  result_1.m_data[2] = auVar17._0_8_;
  Vnorm<double>(&v_1,&result_1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = Dxu.m_data[2];
  auVar21 = vbroadcastsd_avx512f(auVar4);
  auVar21 = vpermi2pd_avx512f(_DAT_00e7e9c0,
                              ZEXT2464(CONCAT816(auVar21._16_8_,
                                                 CONCAT88(Dxu.m_data[1],Dxu.m_data[0]))),
                              ZEXT1664((undefined1  [16])v_1.m_data._0_16_));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = v_1.m_data[2];
  auVar22 = vbroadcastsd_avx512f(auVar5);
  auVar23._0_40_ = auVar21._0_40_;
  auVar23._40_8_ = auVar22._40_8_;
  auVar23._48_8_ = auVar21._48_8_;
  auVar23._56_8_ = auVar21._56_8_;
  _v_1 = vpermi2pd_avx512f(_DAT_00e7ea00,auVar23,ZEXT1664(CONCAT88(Dzu.m_data[1],Dzu.m_data[0])));
  ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2)->motion_type =
       M_MOTION_EXTERNAL;
  ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1)->motion_type =
       M_MOTION_EXTERNAL;
  result_1.m_data[0] = 0.0;
  result_1.m_data[1] = 0.0;
  result_1.m_data[2] = 0.0;
  if (&this->belt_up1 != &result_1) {
    result_1.m_data[0] = (this->belt_up1).m_data[0];
    result_1.m_data[1] = (this->belt_up1).m_data[1];
    result_1.m_data[2] = (this->belt_up1).m_data[2];
  }
  ChMatrix33<double>::Get_A_quaternion((ChQuaternion<double> *)&v_2,(ChMatrix33<double> *)&v_1);
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1,
             (Coordsys *)&result_1);
  if ((Coordsys *)&this->belt_up2 != (Coordsys *)&result_1) {
    result_1.m_data[0] = (this->belt_up2).m_data[0];
    result_1.m_data[1] = (this->belt_up2).m_data[1];
    result_1.m_data[2] = (this->belt_up2).m_data[2];
  }
  ChMatrix33<double>::Get_A_quaternion((ChQuaternion<double> *)&v_2,(ChMatrix33<double> *)&v_1);
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,
             (Coordsys *)&result_1);
  dVar24 = this->r1;
  v_2.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])(this->belt_up2).m_data,
                  *(undefined1 (*) [16])(this->belt_up1).m_data);
  v_2.m_data[2] = (this->belt_up2).m_data[2] - (this->belt_up1).m_data[2];
  dVar25 = ChVector<double>::Length(&v_2);
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar24 * local_320 + dVar25;
  auVar17 = vxorpd_avx512vl(auVar38,auVar10);
  dVar24 = (double)vmovlpd_avx(auVar17);
  (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = dVar24;
  (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = 0.0;
  (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = 0.0;
  dVar24 = DAT_011dd3e0;
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x2848)) {
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = dVar24;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_011dd3e8;
  }
  dVar24 = DAT_011dd3e0;
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x2810)) {
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = dVar24;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] = DAT_011dd3e8;
  }
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC.rot,(ChQuaternion<double> *)&QUNIT);
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC_dt.rot,(ChQuaternion<double> *)QNULL);
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC_dtdt.rot,(ChQuaternion<double> *)QNULL);
  return;
}

Assistant:

void ChLinkPulley::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLockLock::UpdateTime(mytime);

    ChFrame<double> abs_shaft1;
    ChFrame<double> abs_shaft2;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, abs_shaft1);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_shaft2, abs_shaft2);

    ChVector<> dcc_w = Vsub(Get_shaft_pos2(), Get_shaft_pos1());

    // compute actual rotation of the two wheels (relative to truss).
    Vector md1 = abs_shaft1.GetA().transpose() * dcc_w;
    md1.z() = 0;
    md1 = Vnorm(md1);
    Vector md2 = abs_shaft2.GetA().transpose() * dcc_w;
    md2.z() = 0;
    md2 = Vnorm(md2);

    double periodic_a1 = ChAtan2(md1.x(), md1.y());
    double periodic_a2 = ChAtan2(md2.x(), md2.y());
    double old_a1 = a1;
    double old_a2 = a2;
    double turns_a1 = floor(old_a1 / CH_C_2PI);
    double turns_a2 = floor(old_a2 / CH_C_2PI);
    double a1U = turns_a1 * CH_C_2PI + periodic_a1 + CH_C_2PI;
    double a1M = turns_a1 * CH_C_2PI + periodic_a1;
    double a1L = turns_a1 * CH_C_2PI + periodic_a1 - CH_C_2PI;
    a1 = a1M;
    if (fabs(a1U - old_a1) < fabs(a1M - old_a1))
        a1 = a1U;
    if (fabs(a1L - a1) < fabs(a1M - a1))
        a1 = a1L;
    double a2U = turns_a2 * CH_C_2PI + periodic_a2 + CH_C_2PI;
    double a2M = turns_a2 * CH_C_2PI + periodic_a2;
    double a2L = turns_a2 * CH_C_2PI + periodic_a2 - CH_C_2PI;
    a2 = a2M;
    if (fabs(a2U - old_a2) < fabs(a2M - old_a2))
        a2 = a2U;
    if (fabs(a2L - a2) < fabs(a2M - a2))
        a2 = a2L;

    // correct marker positions if phasing is not correct
    double m_delta = 0;
    if (checkphase) {
        double realtau = tau;

        m_delta = a1 - phase - (a2 / realtau);

        if (m_delta > CH_C_PI)
            m_delta -= (CH_C_2PI);  // range -180..+180 is better than 0...360
        if (m_delta > (CH_C_PI / 4.0))
            m_delta = (CH_C_PI / 4.0);  // phase correction only in +/- 45�
        if (m_delta < -(CH_C_PI / 4.0))
            m_delta = -(CH_C_PI / 4.0);
        //***TODO***
    }

    // Move markers 1 and 2 to align them as pulley ends

    ChVector<> d21_w = dcc_w - Get_shaft_dir1() * Vdot(Get_shaft_dir1(), dcc_w);
    ChVector<> D21_w = Vnorm(d21_w);

    shaft_dist = d21_w.Length();

    ChVector<> U1_w = Vcross(Get_shaft_dir1(), D21_w);

    double gamma1 = acos((r1 - r2) / shaft_dist);

    ChVector<> Ru_w = D21_w * cos(gamma1) + U1_w * sin(gamma1);
    ChVector<> Rl_w = D21_w * cos(gamma1) - U1_w * sin(gamma1);

    belt_up1 = Get_shaft_pos1() + Ru_w * r1;
    belt_low1 = Get_shaft_pos1() + Rl_w * r1;
    belt_up2 = Get_shaft_pos1() + d21_w + Ru_w * r2;
    belt_low2 = Get_shaft_pos1() + d21_w + Rl_w * r2;

    // marker alignment
    ChVector<> Dxu = Vnorm(belt_up2 - belt_up1);
    ChVector<> Dyu = Ru_w;
    ChVector<> Dzu = Vnorm(Vcross(Dxu, Dyu));
    Dyu = Vnorm(Vcross(Dzu, Dxu));
    ChMatrix33<> maU(Dxu, Dyu, Dzu);

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);
    marker1->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    ChCoordsys<> newmarkpos;

    // move marker1 in proper positions
    newmarkpos.pos = this->belt_up1;
    newmarkpos.rot = maU.Get_A_quaternion();
    marker1->Impose_Abs_Coord(newmarkpos);  // move marker1 into teeth position
    // move marker2 in proper positions
    newmarkpos.pos = this->belt_up2;
    newmarkpos.rot = maU.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // move marker2 into teeth position

    double phase_correction_up = m_delta * r1;
    double hU = Vlength(belt_up2 - belt_up1) + phase_correction_up;

    // imposed relative positions/speeds
    deltaC.pos = ChVector<>(-hU, 0, 0);
    deltaC_dt.pos = VNULL;
    deltaC_dtdt.pos = VNULL;

    deltaC.rot = QUNIT;  // no relative rotations imposed!
    deltaC_dt.rot = QNULL;
    deltaC_dtdt.rot = QNULL;
}